

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ncnn2int8.cpp
# Opt level: O2

int __thiscall NetQuantize::quantize_innerproduct(NetQuantize *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *this_00;
  int _w;
  vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *pvVar1;
  Layer *pLVar2;
  ulong uVar3;
  bool bVar4;
  iterator iVar5;
  iterator iVar6;
  ulong uVar7;
  ulong uVar8;
  Mat weight_data_int8;
  Mat weight_data_int8_scales;
  Option opt_q;
  Mat bottom_blob_int8_scales;
  Mat weight_data_r2;
  Mat local_180;
  char key [256];
  
  pvVar1 = (this->super_ModelWriter).layers;
  uVar7 = (ulong)((long)(pvVar1->super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>).
                        _M_impl.super__Vector_impl_data._M_finish -
                 (long)(pvVar1->super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>).
                       _M_impl.super__Vector_impl_data._M_start) >> 3;
  uVar8 = uVar7 & 0xffffffff;
  if ((int)uVar7 < 1) {
    uVar8 = 0;
  }
  uVar7 = 0;
  do {
    if (uVar8 == uVar7) {
      return 0;
    }
    bVar4 = std::operator!=(&(((this->super_ModelWriter).layers)->
                             super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>).
                             _M_impl.super__Vector_impl_data._M_start[uVar7]->type,"InnerProduct");
    if ((!bVar4) &&
       (iVar5 = std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ncnn::Mat>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ncnn::Mat>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ncnn::Mat>_>_>
                ::find(&(this->blob_int8scale_table)._M_t,
                       &(((this->super_ModelWriter).layers)->
                        super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)._M_impl.
                        super__Vector_impl_data._M_start[uVar7]->name),
       (_Rb_tree_header *)iVar5._M_node !=
       &(this->blob_int8scale_table)._M_t._M_impl.super__Rb_tree_header)) {
      sprintf(key,"%s_param_0",
              ((((this->super_ModelWriter).layers)->
               super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)._M_impl.
               super__Vector_impl_data._M_start[uVar7]->name)._M_dataplus._M_p);
      std::__cxx11::string::string
                ((string *)&bottom_blob_int8_scales,key,(allocator *)&weight_data_int8_scales);
      iVar6 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ncnn::Mat>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ncnn::Mat>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ncnn::Mat>_>_>
              ::find(&(this->weight_int8scale_table)._M_t,(key_type *)&bottom_blob_int8_scales);
      std::__cxx11::string::~string((string *)&bottom_blob_int8_scales);
      if ((_Rb_tree_header *)iVar6._M_node ==
          &(this->weight_int8scale_table)._M_t._M_impl.super__Rb_tree_header) {
        fwrite("this layer need to be quantized, but no scale param!\n",0x35,1,_stderr);
        return -1;
      }
      pLVar2 = (((this->super_ModelWriter).layers)->
               super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)._M_impl.
               super__Vector_impl_data._M_start[uVar7];
      ncnn::Mat::Mat(&bottom_blob_int8_scales,(Mat *)(iVar5._M_node + 2));
      ncnn::Mat::Mat(&weight_data_int8_scales,(Mat *)(iVar6._M_node + 2));
      fprintf(_stderr,"quantize_innerproduct %s\n",(pLVar2->name)._M_dataplus._M_p);
      this_00 = &pLVar2[1].name.field_2;
      ncnn::Mat::reshape(&weight_data_r2,(Mat *)this_00,
                         *(int *)&pLVar2[1].one_blob_only / *(int *)&pLVar2[1]._vptr_Layer,
                         *(int *)&pLVar2[1]._vptr_Layer,(Allocator *)0x0);
      weight_data_int8.cstep = 0;
      weight_data_int8.data = (void *)0x0;
      weight_data_int8.refcount._0_4_ = 0;
      weight_data_int8.refcount._4_4_ = 0;
      weight_data_int8.elemsize._0_4_ = 0;
      weight_data_int8._20_8_ = 0;
      weight_data_int8.h = 0;
      weight_data_int8.d = 0;
      weight_data_int8.c = 0;
      weight_data_int8.allocator = (Allocator *)0x0;
      weight_data_int8.dims = 0;
      weight_data_int8.w = 0;
      opt_q.lightmode = (this->super_ModelWriter).super_Net.opt.lightmode;
      opt_q._1_3_ = *(undefined3 *)&(this->super_ModelWriter).super_Net.opt.field_0x1;
      opt_q.num_threads = (this->super_ModelWriter).super_Net.opt.num_threads;
      opt_q.blob_allocator = (this->super_ModelWriter).super_Net.opt.blob_allocator;
      opt_q.workspace_allocator = (this->super_ModelWriter).super_Net.opt.workspace_allocator;
      opt_q.openmp_blocktime = (this->super_ModelWriter).super_Net.opt.openmp_blocktime;
      opt_q.use_winograd_convolution =
           (this->super_ModelWriter).super_Net.opt.use_winograd_convolution;
      opt_q.use_sgemm_convolution = (this->super_ModelWriter).super_Net.opt.use_sgemm_convolution;
      opt_q.use_int8_inference = (this->super_ModelWriter).super_Net.opt.use_int8_inference;
      opt_q.use_vulkan_compute = (this->super_ModelWriter).super_Net.opt.use_vulkan_compute;
      uVar3._0_1_ = (this->super_ModelWriter).super_Net.opt.use_bf16_storage;
      uVar3._1_1_ = (this->super_ModelWriter).super_Net.opt.use_fp16_packed;
      uVar3._2_1_ = (this->super_ModelWriter).super_Net.opt.use_fp16_storage;
      uVar3._3_1_ = (this->super_ModelWriter).super_Net.opt.use_fp16_arithmetic;
      uVar3._4_1_ = (this->super_ModelWriter).super_Net.opt.use_int8_packed;
      uVar3._5_1_ = (this->super_ModelWriter).super_Net.opt.use_int8_storage;
      uVar3._6_1_ = (this->super_ModelWriter).super_Net.opt.use_int8_arithmetic;
      uVar3._7_1_ = (this->super_ModelWriter).super_Net.opt.use_packing_layout;
      opt_q.use_shader_pack8 = (this->super_ModelWriter).super_Net.opt.use_shader_pack8;
      opt_q.use_subgroup_basic = (this->super_ModelWriter).super_Net.opt.use_subgroup_basic;
      opt_q.use_subgroup_vote = (this->super_ModelWriter).super_Net.opt.use_subgroup_vote;
      opt_q.use_subgroup_ballot = (this->super_ModelWriter).super_Net.opt.use_subgroup_ballot;
      opt_q.use_subgroup_shuffle = (this->super_ModelWriter).super_Net.opt.use_subgroup_shuffle;
      opt_q.use_image_storage = (this->super_ModelWriter).super_Net.opt.use_image_storage;
      opt_q.use_tensor_storage = (this->super_ModelWriter).super_Net.opt.use_tensor_storage;
      opt_q.use_weight_fp16_storage =
           (this->super_ModelWriter).super_Net.opt.use_weight_fp16_storage;
      opt_q.flush_denormals = (this->super_ModelWriter).super_Net.opt.flush_denormals;
      opt_q.use_local_pool_allocator =
           (this->super_ModelWriter).super_Net.opt.use_local_pool_allocator;
      opt_q.use_reserved_1 = (this->super_ModelWriter).super_Net.opt.use_reserved_1;
      opt_q.use_reserved_2 = (this->super_ModelWriter).super_Net.opt.use_reserved_2;
      opt_q.use_reserved_3 = (this->super_ModelWriter).super_Net.opt.use_reserved_3;
      opt_q.use_reserved_4 = (this->super_ModelWriter).super_Net.opt.use_reserved_4;
      opt_q.use_reserved_5 = (this->super_ModelWriter).super_Net.opt.use_reserved_5;
      opt_q.use_reserved_6 = (this->super_ModelWriter).super_Net.opt.use_reserved_6;
      opt_q.use_reserved_7 = (this->super_ModelWriter).super_Net.opt.use_reserved_7;
      opt_q.use_reserved_8 = (this->super_ModelWriter).super_Net.opt.use_reserved_8;
      opt_q.use_reserved_9 = (this->super_ModelWriter).super_Net.opt.use_reserved_9;
      opt_q.use_reserved_10 = (this->super_ModelWriter).super_Net.opt.use_reserved_10;
      opt_q.use_reserved_11 = (this->super_ModelWriter).super_Net.opt.use_reserved_11;
      opt_q._32_8_ = uVar3 & 0xffffffffffffff;
      ncnn::quantize_to_int8(&weight_data_r2,&weight_data_int8,&weight_data_int8_scales,&opt_q);
      if ((weight_data_int8.data == (void *)0x0) ||
         ((long)weight_data_int8.c * weight_data_int8.cstep == 0)) {
        ncnn::Mat::~Mat(&weight_data_int8);
        ncnn::Mat::~Mat(&weight_data_r2);
        ncnn::Mat::~Mat(&weight_data_int8_scales);
        ncnn::Mat::~Mat(&bottom_blob_int8_scales);
        return -100;
      }
      _w._0_1_ = pLVar2[1].one_blob_only;
      _w._1_1_ = pLVar2[1].support_inplace;
      _w._2_1_ = pLVar2[1].support_vulkan;
      _w._3_1_ = pLVar2[1].support_packing;
      ncnn::Mat::reshape(&local_180,&weight_data_int8,_w,(Allocator *)0x0);
      ncnn::Mat::operator=((Mat *)this_00,&local_180);
      ncnn::Mat::~Mat(&local_180);
      ncnn::Mat::~Mat(&weight_data_int8);
      ncnn::Mat::~Mat(&weight_data_r2);
      pLVar2[1].support_bf16_storage = true;
      pLVar2[1].support_fp16_storage = false;
      pLVar2[1].support_int8_storage = false;
      pLVar2[1].support_image_storage = false;
      ncnn::Mat::operator=((Mat *)&pLVar2[2].userdata,&weight_data_int8_scales);
      ncnn::Mat::operator=((Mat *)((long)&pLVar2[2].name.field_2 + 8),&bottom_blob_int8_scales);
      ncnn::Mat::~Mat(&weight_data_int8_scales);
      ncnn::Mat::~Mat(&bottom_blob_int8_scales);
    }
    uVar7 = uVar7 + 1;
  } while( true );
}

Assistant:

int NetQuantize::quantize_innerproduct()
{
    const int layer_count = static_cast<int>(layers.size());
    for (int i = 0; i < layer_count; i++)
    {
        // find convolution layer
        if (layers[i]->type != "InnerProduct")
            continue;

        // find InnerProduct layer
        std::map<std::string, ncnn::Mat>::iterator iter_data = blob_int8scale_table.find(layers[i]->name);
        if (iter_data == blob_int8scale_table.end())
            continue;

        char key[256];
        sprintf(key, "%s_param_0", layers[i]->name.c_str());

        std::map<std::string, ncnn::Mat>::iterator iter = weight_int8scale_table.find(key);
        if (iter == weight_int8scale_table.end())
        {
            fprintf(stderr, "this layer need to be quantized, but no scale param!\n");
            return -1;
        }

        // InnerProduct - quantize weight from fp32 to int8
        ncnn::InnerProduct* fc = (ncnn::InnerProduct*)layers[i];

        ncnn::Mat bottom_blob_int8_scales = iter_data->second;
        ncnn::Mat weight_data_int8_scales = iter->second;

        fprintf(stderr, "quantize_innerproduct %s\n", fc->name.c_str());

        {
            const int num_input = fc->weight_data_size / fc->num_output;

            ncnn::Mat weight_data_r2 = fc->weight_data.reshape(num_input, fc->num_output);

            ncnn::Mat weight_data_int8;
            ncnn::Option opt_q = opt;
            opt_q.use_packing_layout = false;
            ncnn::quantize_to_int8(weight_data_r2, weight_data_int8, weight_data_int8_scales, opt_q);
            if (weight_data_int8.empty())
                return -100;

            fc->weight_data = weight_data_int8.reshape(fc->weight_data_size);
        }

        fc->int8_scale_term = 2;
        fc->weight_data_int8_scales = weight_data_int8_scales;
        fc->bottom_blob_int8_scales = bottom_blob_int8_scales;
    }

    return 0;
}